

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void __thiscall
Am_Object_Data::remove_subconstraint(Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *proto)

{
  bool bVar1;
  int iVar2;
  Am_Slot_Data *pAVar3;
  Am_Constraint *proto_00;
  Am_Constraint_Tag constraint_tag;
  undefined4 extraout_var;
  Am_Object_Data *this_00;
  Am_Constraint_Iterator iter;
  Am_Slot local_50;
  Am_Object_Data *local_48;
  Am_Constraint_Iterator local_40;
  
  pAVar3 = find_slot(this,key);
  if ((pAVar3 != (Am_Slot_Data *)0x0) && (pAVar3->context == this)) {
    local_50.data = pAVar3;
    local_48 = this;
    Am_Constraint_Iterator::Am_Constraint_Iterator(&local_40,&local_50);
    Am_Constraint_Iterator::Start(&local_40);
    bVar1 = Am_Constraint_Iterator::Last(&local_40);
    if (!bVar1) {
      do {
        proto_00 = Am_Constraint_Iterator::Get(&local_40);
        constraint_tag = Am_Constraint_Iterator::Get_Tag(&local_40);
        Am_Constraint_Iterator::Next(&local_40);
        iVar2 = (*(proto_00->super_Am_Registered_Type)._vptr_Am_Registered_Type[10])(proto_00);
        if ((Am_Constraint *)CONCAT44(extraout_var,iVar2) == proto) {
          this_00 = local_48->first_instance;
          if (this_00 != (Am_Object_Data *)0x0 && (*(ushort *)&pAVar3->field_0x38 & 0x300) == 0x100)
          {
            do {
              remove_subconstraint(this_00,key,proto_00);
              this_00 = this_00->next_instance;
            } while (this_00 != (Am_Object_Data *)0x0);
          }
          local_50.data = pAVar3;
          Am_Slot::Remove_Constraint(&local_50,constraint_tag);
        }
        bVar1 = Am_Constraint_Iterator::Last(&local_40);
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void
Am_Object_Data::remove_subconstraint(Am_Slot_Key key, Am_Constraint *proto)
{
  Am_Slot_Data *slot = find_slot(key);
  if (slot && slot->context == this) {
    Am_Constraint *constraint;
    Am_Constraint_Tag tag;
    Am_Constraint_Iterator iter((const Am_Slot &)slot);
    iter.Start();
    while (!iter.Last()) {
      constraint = iter.Get();
      tag = iter.Get_Tag();
      iter.Next();
      if (constraint->Get_Prototype() == proto) {
        if (slot->rule == Am_INHERIT)
          prop_remove_constraint(key, constraint);
        Am_Slot(slot).Remove_Constraint(tag);
      }
    }
  }
}